

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

int lj_cparse(CPState *cp)

{
  int iVar1;
  long in_RDI;
  int errcode;
  CTState savects_;
  undefined4 in_stack_fffffffffffffe18;
  undefined1 local_1e0 [8];
  undefined4 local_1d8;
  undefined1 auStack_108 [256];
  long local_8;
  
  local_8 = in_RDI;
  memcpy(local_1e0,*(void **)(in_RDI + 0x40),0x1d8);
  iVar1 = lj_vm_cpcall(*(undefined8 *)(local_8 + 0x38),0,local_8,cpcparser);
  if (iVar1 != 0) {
    *(undefined4 *)(*(long *)(local_8 + 0x40) + 8) = local_1d8;
    memcpy((void *)(*(long *)(local_8 + 0x40) + 0xd8),auStack_108,0x100);
  }
  cp_cleanup((CPState *)CONCAT44(iVar1,in_stack_fffffffffffffe18));
  return iVar1;
}

Assistant:

int lj_cparse(CPState *cp)
{
  LJ_CTYPE_SAVE(cp->cts);
  int errcode = lj_vm_cpcall(cp->L, NULL, cp, cpcparser);
  if (errcode)
    LJ_CTYPE_RESTORE(cp->cts);
  cp_cleanup(cp);
  return errcode;
}